

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenTableVerifier
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr)

{
  bool bVar1;
  reference ppFVar2;
  string local_268;
  FieldDef *local_248;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_238;
  const_iterator it;
  string local_220;
  undefined1 local_200 [8];
  CodeWriter code_;
  string *code_ptr_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  code_._472_8_ = code_ptr;
  std::__cxx11::string::string((string *)&local_220);
  CodeWriter::CodeWriter((CodeWriter *)local_200,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  GetStartOfTableVerifier(this,struct_def,(string *)code_._472_8_);
  local_238._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_238,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_238);
    local_248 = *ppFVar2;
    if ((local_248->deprecated & 1U) == 0) {
      GenVerifyCall(this,(CodeWriter *)local_200,local_248,"");
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_238);
  }
  CodeWriter::ToString_abi_cxx11_(&local_268,(CodeWriter *)local_200);
  std::__cxx11::string::operator+=((string *)code_._472_8_,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  GetEndOfTableVerifier(this,(string *)code_._472_8_);
  CodeWriter::~CodeWriter((CodeWriter *)local_200);
  return;
}

Assistant:

void GenTableVerifier(const StructDef &struct_def, std::string *code_ptr) {
    CodeWriter code_;

    GetStartOfTableVerifier(struct_def, code_ptr);

    // Generate struct fields accessors
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      GenVerifyCall(code_, field, "");
    }

    *code_ptr += code_.ToString();

    GetEndOfTableVerifier(code_ptr);
  }